

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9GlaRefine(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_3c;
  int fVerbose;
  int c;
  int fMinCut;
  int iFrameExtra;
  int iFrameStart;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fMinCut = 0;
  c = 0;
  local_3c = 0;
  Extra_UtilGetoptReset();
LAB_00279b96:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FGmvh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9GlaRefine(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if (iVar1 == 0) {
        Abc_Print(-1,"The network is combinational.\n");
        return 0;
      }
      if (pAbc->pCex == (Abc_Cex_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9GlaRefine(): There is no counter-example.\n");
        return 1;
      }
      iVar1 = Gia_ManNewRefine(pAbc->pGia,pAbc->pCex,fMinCut,c,local_3c);
      pAbc->Status = iVar1;
      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
      return 0;
    }
    switch(iVar1) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_00279db0;
      }
      fMinCut = atoi(argv[globalUtilOptind]);
      iVar1 = fMinCut;
      break;
    case 0x47:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by an integer.\n");
        goto LAB_00279db0;
      }
      c = atoi(argv[globalUtilOptind]);
      iVar1 = c;
      break;
    default:
      goto LAB_00279db0;
    case 0x68:
      goto LAB_00279db0;
    case 0x6d:
      goto LAB_00279b96;
    case 0x76:
      local_3c = local_3c ^ 1;
      goto LAB_00279b96;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_00279db0:
      Abc_Print(-2,"usage: &gla_refine [-FG num] [-vh]\n");
      Abc_Print(-2,"\t         refines the pre-computed gate map using the counter-example\n");
      Abc_Print(-2,"\t-F num : starting timeframe for suffix refinement [default = %d]\n",
                (ulong)(uint)fMinCut);
      Abc_Print(-2,"\t-G num : the number of additional timeframes to try [default = %d]\n",
                (ulong)(uint)c);
      pcVar2 = "no";
      if (local_3c != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9GlaRefine( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Gia_ManNewRefine( Gia_Man_t * p, Abc_Cex_t * pCex, int iFrameStart, int iFrameExtra, int fVerbose );
    int iFrameStart = 0;
    int iFrameExtra = 0;
    int fMinCut = 1;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FGmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrameStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrameStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrameExtra = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrameExtra < 0 )
                goto usage;
            break;
        case 'm':
            fMinCut ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GlaRefine(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pAbc->pCex == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GlaRefine(): There is no counter-example.\n" );
        return 1;
    }
    pAbc->Status = Gia_ManNewRefine( pAbc->pGia, pAbc->pCex, iFrameStart, iFrameExtra, fVerbose );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &gla_refine [-FG num] [-vh]\n" );
    Abc_Print( -2, "\t         refines the pre-computed gate map using the counter-example\n" );
    Abc_Print( -2, "\t-F num : starting timeframe for suffix refinement [default = %d]\n", iFrameStart );
    Abc_Print( -2, "\t-G num : the number of additional timeframes to try [default = %d]\n", iFrameExtra );
//    Abc_Print( -2, "\t-m     : toggle using min-cut to derive the refinements [default = %s]\n", fMinCut? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}